

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::Success::Success(Success *this,string *ename,string *msg,ExitCodes exit_code)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string(&local_48,ename);
  ::std::__cxx11::string::string(&bStack_68,msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&bStack_68,exit_code);
  ::std::__cxx11::string::~string((string *)&bStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_00482050;
  return;
}

Assistant:

Success() : Success("Successfully completed, should be caught and quit", ExitCodes::Success) {}